

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

void __thiscall
icu_63::number::FormattedNumber::populateFieldPosition
          (FormattedNumber *this,FieldPosition *fieldPosition,UErrorCode *status)

{
  UFormattedNumberData *pUVar1;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  pUVar1 = this->fResults;
  if (pUVar1 != (UFormattedNumberData *)0x0) {
    fieldPosition->fBeginIndex = 0;
    fieldPosition->fEndIndex = 0;
    impl::NumberStringBuilder::nextFieldPosition(&pUVar1->string,fieldPosition,status);
    return;
  }
  *status = this->fErrorCode;
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }